

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O3

double Place_Turn(int dep,GameBoard *gameBoard,int pl_col,int this_bl_type,int *finalX,int *finalY,
                 int *finalO,int *blockFE)

{
  undefined8 *puVar1;
  _Base_ptr p_Var2;
  double dVar3;
  pointer pdVar4;
  Tetris te;
  pointer pTVar5;
  GameBoard *gameBoard_00;
  int iVar6;
  _Self __tmp_1;
  _Base_ptr p_Var7;
  time_t tVar8;
  undefined8 extraout_RAX;
  ulong uVar9;
  long lVar10;
  pointer pvVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  undefined4 in_register_0000003c;
  double *pdVar15;
  Block *this;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [8];
  double dVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  _Self __tmp;
  int this_ht;
  int ch2;
  vector<Tetris,_std::allocator<Tetris>_> loc;
  int ch1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A;
  set<Plan,_std::less<Plan>,_std::allocator<Plan>_> s;
  double p1 [45];
  double p2 [45];
  GameBoard nowBoard;
  Standard_Simplex ss;
  Slash_Simplex as;
  double dStack_1cf98;
  pointer piStack_1cf90;
  int iStack_1cf80;
  bool abStack_1cf7c [4];
  undefined8 uStack_1cf78;
  ulong uStack_1cf70;
  vector<Tetris,_std::allocator<Tetris>_> vStack_1cf68;
  GameBoard *pGStack_1cf48;
  undefined8 uStack_1cf40;
  int *piStack_1cf38;
  int *piStack_1cf30;
  int *piStack_1cf28;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vStack_1cf20;
  _Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_> _Stack_1cf08;
  Board aBStack_1ced8 [2];
  Block aBStack_1cd68 [22];
  GameBoard GStack_1cbfc;
  Standard_Simplex SStack_1c1d8;
  undefined1 auStack_15fd8 [8];
  pointer piStack_15fd0;
  pointer piStack_15fc8;
  undefined8 auStack_15fc0 [104];
  ulong auStack_15c80 [11131];
  char acStack_a8 [112];
  double local_38;
  
  uStack_1cf78 = CONCAT44(in_register_0000003c,dep);
  if (dep == 5) {
    dVar19 = naive_place(gameBoard,pl_col,this_bl_type);
    return dVar19;
  }
  vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_1cf70 = CONCAT44(uStack_1cf70._4_4_,pl_col);
  GameBoard::getPlaces(gameBoard,pl_col,this_bl_type,&vStack_1cf68,true);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&vStack_1cf20,
           ((long)vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,
           (allocator_type *)auStack_15fd8);
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_1cf08._M_impl.super__Rb_tree_header._M_header;
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGStack_1cf48 = gameBoard;
  _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left;
  GameBoard::GameBoard(&GStack_1cbfc);
  if (vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::
    ~_Rb_tree(&_Stack_1cf08);
    dStack_1cf98 = -100000.0;
  }
  else {
    piStack_1cf38 = finalO;
    dStack_1cf98 = 0.0;
    this = aBStack_1cd68;
    uVar17 = 0;
    piStack_1cf30 = finalX;
    piStack_1cf28 = finalY;
    do {
      gameBoard_00 = pGStack_1cf48;
      iVar6 = (int)uStack_1cf70;
      global_i = (int)uVar17;
      Board::Board((Board *)&SStack_1c1d8,(int)uStack_1cf70,pGStack_1cf48);
      Board::Board(aBStack_1ced8,iVar6,gameBoard_00);
      puVar1 = (undefined8 *)
               ((long)&(vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                        super__Vector_impl_data._M_start)->blockY + (long)dStack_1cf98);
      te._16_8_ = *puVar1;
      te._0_16_ = *(undefined1 (*) [16])
                   ((long)&(vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl
                            .super__Vector_impl_data._M_start)->gameBoard + (long)dStack_1cf98);
      te.shape = (int (*) [8])puVar1[1];
      te._32_8_ = *(undefined8 *)
                   ((long)&(vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl
                            .super__Vector_impl_data._M_start)->color + (long)dStack_1cf98);
      Block::Block(this,te);
      memcpy((Board *)auStack_15fd8,&SStack_1c1d8,0x88);
      abStack_1cf7c[0] = false;
      if (Eval.super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_0011a4bb;
      }
      piStack_1cf90 =
           (pointer)(*Eval._M_invoker)((_Any_data *)&Eval,(Board *)auStack_15fd8,this,
                                       (double *)&uStack_1cf40,abStack_1cf7c);
      eval(aBStack_1ced8,this,(int *)abStack_1cf7c,&iStack_1cf80);
      auStack_15fd8 = (undefined1  [8])piStack_1cf90;
      if ((int)uStack_1cf78 == 1) {
        if (gameBoard_00->currBotColor == iVar6) {
          auStack_15fd8 = (undefined1  [8])((double)piStack_1cf90 + -100.0);
          if (enemyele + iStack_1cf80 < 0x15) {
            auStack_15fd8 = (undefined1  [8])piStack_1cf90;
          }
          if (0x14 < enemyht + myele) {
            auStack_15fd8 = (undefined1  [8])((double)auStack_15fd8 + 10000.0);
          }
        }
        else if (0x14 < iStack_1cf80 + myele) {
          auStack_15fd8 = (undefined1  [8])((double)piStack_1cf90 + -100.0);
        }
      }
      piStack_15fd0 = (pointer)CONCAT44(uStack_1cf40._4_4_,(int)uStack_1cf40);
      piStack_15fc8 = (pointer)CONCAT44(piStack_15fc8._4_4_,(int)uVar17);
      std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::
      _M_insert_unique<Plan>(&_Stack_1cf08,(Plan *)auStack_15fd8);
      uVar17 = uVar17 + 1;
      uVar13 = ((long)vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      dStack_1cf98 = (double)((long)dStack_1cf98 + 0x28);
    } while (uVar17 <= uVar13 && uVar13 - uVar17 != 0);
    if ((int)uVar13 < 1) {
      piStack_1cf90 = (pointer)0x0;
    }
    else {
      iVar6 = (int)uStack_1cf78;
      lVar16 = 0;
      lVar10 = 0;
      p_Var7 = _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left;
      auVar18 = (undefined1  [8])(pointer)0x0;
      do {
        pTVar5 = vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar14 = *(int *)&p_Var7[1]._M_left;
        memcpy(&GStack_1cbfc,pGStack_1cf48,0xa24);
        iVar22 = (int)uStack_1cf70;
        GameBoard::place(&GStack_1cbfc,(int)uStack_1cf70,this_bl_type,pTVar5[iVar14].blockX,
                         pTVar5[iVar14].blockY,pTVar5[iVar14].orientation);
        GameBoard::eliminate(&GStack_1cbfc,iVar22);
        Jam_Turn((vector<int,_std::allocator<int>_> *)auStack_15fd8,iVar6 + 1,&GStack_1cbfc,iVar22,
                 (vector<double,_std::allocator<double>_> *)
                 ((long)&((vStack_1cf20.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar16));
        piStack_1cf90 = (pointer)auStack_15fd8;
        auStack_15fd8 = (undefined1  [8])0x0;
        piStack_15fd0 = (pointer)0x0;
        piStack_15fc8 = (pointer)0x0;
        if ((auVar18 != (undefined1  [8])0x0) &&
           (operator_delete((void *)auVar18), auStack_15fd8 != (undefined1  [8])0x0)) {
          operator_delete((void *)auStack_15fd8);
        }
        lVar10 = lVar10 + 1;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
        uVar12 = (int)((ulong)((long)vStack_1cf68.
                                     super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
        if (9 < (int)uVar12) {
          uVar12 = 10;
        }
        uVar13 = (ulong)uVar12;
        lVar16 = lVar16 + 0x18;
        auVar18 = (undefined1  [8])piStack_1cf90;
      } while (lVar10 < (int)uVar12);
    }
    uStack_1cf70 = (long)((vStack_1cf20.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)((vStack_1cf20.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
    dStack_1cf98 = (double)(uStack_1cf70 >> 3);
    iVar6 = (int)uVar13;
    uVar12 = SUB84(dStack_1cf98,0);
    if (0 < iVar6) {
      lVar10 = (long)(int)uStack_1cf78;
      uVar17 = 0;
      p_Var7 = _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if (0 < (int)uVar12) {
          p_Var2 = p_Var7[1]._M_parent;
          dVar19 = F_ROUND_WIGHT[lVar10];
          pdVar4 = vStack_1cf20.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar17].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar3 = *(double *)(p_Var7 + 1);
          uVar9 = 0;
          do {
            pdVar4[uVar9] = pdVar4[uVar9] + dVar19 * dVar3 + (double)p_Var2;
            uVar9 = uVar9 + 1;
          } while ((uVar12 & 0x7fffffff) != uVar9);
        }
        uVar17 = uVar17 + 1;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while (uVar17 != (uVar13 & 0xffffffff));
    }
    memset(SStack_1c1d8.b,0,0x61f8);
    lVar10 = (long)iVar6;
    SStack_1c1d8.n = iVar6 + 2;
    SStack_1c1d8.m = uVar12 + 2;
    this = (Block *)(lVar10 + 1);
    SStack_1c1d8.c[lVar10 + 1] = 1.0;
    SStack_1c1d8.c[lVar10 + 2] = -1.0;
    if (0 < (int)uVar12) {
      pdVar15 = SStack_1c1d8.a[1] + 1;
      uVar17 = 1;
      do {
        SStack_1c1d8.b[uVar17] = 0.0;
        if (0 < iVar6) {
          lVar16 = 0;
          pvVar11 = vStack_1cf20.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pdVar15[lVar16] =
                 -(pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar17 - 1];
            lVar16 = lVar16 + 1;
            pvVar11 = pvVar11 + 1;
          } while (((ulong)this & 0xffffffff) - 1 != lVar16);
        }
        SStack_1c1d8.a[uVar17][lVar10 + 1] = 1.0;
        SStack_1c1d8.a[uVar17][lVar10 + 2] = -1.0;
        uVar17 = uVar17 + 1;
        pdVar15 = pdVar15 + 0x37;
      } while (uVar17 != uVar12 + 1);
    }
    lVar10 = uStack_1cf70 * 0x20000000 + 0x100000000;
    *(undefined8 *)((long)SStack_1c1d8.b + (lVar10 >> 0x1d)) = 0x3ff0000000000000;
    if (iVar6 < 1) {
      SStack_1c1d8.b[SStack_1c1d8.m] = -1.0;
    }
    else {
      lVar10 = lVar10 >> 0x20;
      lVar16 = ((ulong)this & 0xffffffff) - 2;
      auVar21._8_4_ = (int)lVar16;
      auVar21._0_8_ = lVar16;
      auVar21._12_4_ = (int)((ulong)lVar16 >> 0x20);
      uVar17 = 0;
      auVar21 = auVar21 ^ _DAT_0011e230;
      do {
        auVar23._8_4_ = (int)uVar17;
        auVar23._0_8_ = uVar17;
        auVar23._12_4_ = (int)(uVar17 >> 0x20);
        auVar23 = (auVar23 | _DAT_0011e220) ^ _DAT_0011e230;
        iVar14 = auVar21._4_4_;
        iVar22 = auVar21._12_4_;
        if ((bool)(~(auVar23._4_4_ == iVar14 && auVar21._0_4_ < auVar23._0_4_ ||
                    iVar14 < auVar23._4_4_) & 1)) {
          SStack_1c1d8.a[lVar10][uVar17 + 1] = 1.0;
        }
        if ((auVar23._12_4_ != iVar22 || auVar23._8_4_ <= auVar21._8_4_) && auVar23._12_4_ <= iVar22
           ) {
          SStack_1c1d8.a[lVar10][uVar17 + 2] = 1.0;
        }
        uVar17 = uVar17 + 2;
      } while (((uint)this & 0x7ffffffe) != uVar17);
      SStack_1c1d8.b[SStack_1c1d8.m] = -1.0;
      if (0 < iVar6) {
        uVar17 = 0;
        do {
          auVar24._8_4_ = (int)uVar17;
          auVar24._0_8_ = uVar17;
          auVar24._12_4_ = (int)(uVar17 >> 0x20);
          auVar23 = (auVar24 | _DAT_0011e220) ^ _DAT_0011e230;
          if ((bool)(~(auVar23._4_4_ == iVar14 && auVar21._0_4_ < auVar23._0_4_ ||
                      iVar14 < auVar23._4_4_) & 1)) {
            SStack_1c1d8.a[SStack_1c1d8.m][uVar17 + 1] = -1.0;
          }
          if ((auVar23._12_4_ != iVar22 || auVar23._8_4_ <= auVar21._8_4_) &&
              auVar23._12_4_ <= iVar22) {
            SStack_1c1d8.a[SStack_1c1d8.m][uVar17 + 2] = -1.0;
          }
          uVar17 = uVar17 + 2;
        } while (((uint)this & 0x7ffffffe) != uVar17);
      }
    }
    Slash_Simplex::Slash_Simplex((Slash_Simplex *)auStack_15fd8,&SStack_1c1d8);
    Slash_Simplex::simplex((Slash_Simplex *)auStack_15fd8,false);
    if ((int)uStack_1cf78 == 1) {
LAB_0011a4bb:
      iVar14 = pGStack_1cf48->turnID;
      tVar8 = time((time_t *)0x0);
      srand(iVar14 * (int)tVar8);
      if (0 < iVar6) {
        lVar10 = 0;
        do {
          uVar20 = 0;
          if (acStack_a8[lVar10 + 1] == '\x01') {
            uVar20 = auStack_15fc0[lVar10];
          }
          *(undefined8 *)(aBStack_1ced8[0].rows + lVar10 * 2 + 2) = uVar20;
          lVar10 = lVar10 + 1;
        } while (((ulong)this & 0xffffffff) - 1 != lVar10);
      }
      if (0 < dStack_1cf98._0_4_) {
        lVar10 = 0;
        do {
          iVar14 = iVar6 + 3 + (int)lVar10;
          uVar17 = 0;
          if (acStack_a8[iVar14] == '\0') {
            uVar17 = auStack_15c80[iVar14] ^ 0x8000000000000000;
          }
          *(ulong *)(&aBStack_1cd68[0].o + lVar10 * 2) = uVar17;
          lVar10 = lVar10 + 1;
        } while ((ulong)(dStack_1cf98._0_4_ + 1) - 1 != lVar10);
      }
      get_CH((double *)aBStack_1ced8,iVar6,(int *)&uStack_1cf40);
      p_Var7 = _Stack_1cf08._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < (int)uStack_1cf40) {
        do {
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
          uStack_1cf40._0_4_ = (int)uStack_1cf40 + -1;
        } while ((int)uStack_1cf40 != 0);
      }
      iVar6 = *(int *)&p_Var7[1]._M_left;
      *piStack_1cf30 =
           vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
           super__Vector_impl_data._M_start[iVar6].blockX;
      *piStack_1cf28 =
           vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
           super__Vector_impl_data._M_start[iVar6].blockY;
      *piStack_1cf38 =
           vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
           super__Vector_impl_data._M_start[iVar6].orientation;
      get_CH((double *)aBStack_1cd68,dStack_1cf98._0_4_,(int *)abStack_1cf7c);
      std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::
      ~_Rb_tree(&_Stack_1cf08);
      if (piStack_1cf90 != (pointer)0x0) {
        operator_delete(piStack_1cf90);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&vStack_1cf20);
      if (vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(extraout_RAX);
    }
    dStack_1cf98 = local_38;
    std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::
    ~_Rb_tree(&_Stack_1cf08);
    if (piStack_1cf90 != (pointer)0x0) {
      operator_delete(piStack_1cf90);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&vStack_1cf20);
  if (vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_1cf68.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dStack_1cf98;
}

Assistant:

double Place_Turn(int dep, GameBoard& gameBoard, int pl_col, int this_bl_type, int &finalX = nouse, int &finalY = nouse, int &finalO = nouse, int &blockFE = nouse) //floc 表示最终选的块的位置,blockFE表示给敌人的块
{
    if (dep == (gameBoard.turnID < 10 ? DEPTH_LIM_2 : DEPTH_LIM_1)) //最后一层直接贪
        return naive_place(gameBoard, pl_col, this_bl_type);
    //debug(dep);
    std::vector<Tetris> loc;
    gameBoard.getPlaces(pl_col, this_bl_type, loc);
    int i, j, n, m;
    vector<vector<double> > A(loc.size());
    vector<int> index;
    set<Plan> s;
    GameBoard nowBoard;
    if(loc.size() == 0)
        return -1e5;
    for (i = 0; i < loc.size(); i++)
    {
        global_i = i;
        #ifdef DEBUG_DECIDE
        debug(i);
        debug(loc[i].blockX);
        debug(loc[i].blockY);
        debug(loc[i].orientation);
        #endif
        Board myBoard(pl_col, gameBoard), myBoard2(pl_col, gameBoard);
        Block now_bl = Block(loc[i]);
        double inh;
        double now_val = Eval(myBoard, now_bl, inh,0);
        int this_ele, this_ht;
        eval(myBoard2, now_bl, this_ele, this_ht);
        if(dep == 1)
        {
            if(pl_col == gameBoard.currBotColor) //考虑自己的局面
            {
                if(this_ht + enemyele > 20)
                    now_val -= Risk_Value;
                if(myele + enemyht > 20)
                    now_val += MustWin;
            }
            else
            {
                if(myele + this_ht > 20)
                    now_val -= Risk_Value;
            }
        }
        
        s.insert(Plan(now_val, inh, i));
    }
        //debug(now_val);
    set<Plan>::iterator it=s.begin();
    for (i = 0; i < min((int)loc.size(), MAX_SEARCH); i++, it++)    
    {
        int ind = (*it).idx;
        //debug(ind);
        #ifdef DEBUG_DECIDE
        debug(loc[ind].blockX);
        debug(loc[ind].blockY);
        debug(loc[ind].orientation);
        debug((*it).eva);
        #endif
        nowBoard = gameBoard;
        nowBoard.place(pl_col, this_bl_type, loc[ind].blockX, loc[ind].blockY, loc[ind].orientation);
        nowBoard.eliminate(pl_col);
        index = Jam_Turn(dep + 1, nowBoard, pl_col, A[i]);
    }
    n = min((int)loc.size(), MAX_SEARCH);
    m = A[0].size();

    //debug(n);
    //debug(m);
    for(it = s.begin(), i = 0; i < n; i++, it++)
    {
        double val = (*it).eva;
        double inh = (*it).inh;
        for (j = 0; j < m; j++)
        {
            #ifdef DEBUG_DECIDE
            cerr << A[i][j] << " ";
            #endif
            A[i][j] += val * F_ROUND_WIGHT[dep];
            A[i][j] += inh;
        }
        #ifdef DEBUG_DECIDE
        cerr << endl;
        #endif
    }
    Standard_Simplex ss;
    ss.n = n + 2, ss.m = m + 2;
    ss.c[n+1] = 1;
    ss.c[n+2] = -1;
    for(i = 1; i <= m; i++)
    {
        ss.b[i] = 0;
        for(j = 1; j <= n; j++)
            ss.a[i][j] = -A[j-1][i-1]; //注意下标要-1
        ss.a[i][n+1] = 1;
        ss.a[i][n+2] = -1;
    }   
    ss.b[m+1] = 1;
    for(j = 1; j <= n; j++)
        ss.a[m+1][j] = 1;
    ss.b[m+2] = -1;
    for(j = 1; j <= n; j++)
        ss.a[m+2][j] = -1;

    Slash_Simplex as(ss);
    //as.Print();
    int zt = as.simplex(0);
    //debug("end*******************************************");
    if(dep != 1) //不是第一层就不用考虑决策的事情
        return as.rel;
    //决策过程
    srand(gameBoard.turnID * time(0));
    double p1[45], p2[45], rd, sum;
    int ch1, ch2;
    for (i = 1; i <= n; i++)
    {
        if(as.basic[i])
            p1[i] = as.b[i];
        else p1[i] = 0;
        #ifdef DEBUG_DECIDE
        cerr << p1[i] << " ";
        #endif
    }
    #ifdef DEBUG_DECIDE
    cerr << endl;
    #endif
    for (i = 1; i <= m; i++) //得到对偶的答案
    {
        if(!as.basic[i+n+2])
            p2[i] = -as.c[i+n+2];
        else p2[i] = 0;
        #ifdef DEBUG_DECIDE
        cerr << p2[i] << " ";
        #endif
    }

    //debug("get ans");
    #ifdef DEBUG_DECIDE
    cerr << endl;
    #endif
    
    get_CH(p1,n,ch1);
    //debug(ch1);
    for (it = s.begin(), i = 0; i < ch1; i++, it++);
    int ind = (*it).idx;
    finalX = loc[ind].blockX;
    finalY = loc[ind].blockY;
    finalO = loc[ind].orientation;
    //debug(ch1);
    //debug("get loc");

    get_CH(p2,m,ch2);

    /*sum = 0;
    max_p = 0;
    rd = (double)(rand()%10000) / 10000.0;
    for (i = 1; i <= m; i++)
        if(p2[i] >= max_p)
        {
            ch2 = i - 1;
            max_p = p2[i];
            //break;
        }
        //else sum += p2[i];
    */
    blockFE = index[ch2];
}